

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLinLin>::operator()
          (StairsRenderer<ImPlot::GetterYs<signed_char>,_ImPlot::TransformerLinLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  ImVec2 IVar3;
  int iVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterYs<signed_char> *pGVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  bool bVar11;
  ImDrawIdx IVar12;
  ImVec2 IVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pGVar8 = this->Getter;
  iVar4 = pGVar8->Count;
  iVar5 = this->Transformer->YAxis;
  IVar13.x = (float)((((double)(prim + 1) * pGVar8->XScale + pGVar8->X0) -
                     (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                    (double)GImPlot->PixelRange[iVar5].Min.x);
  fVar14 = (float)(((double)(int)pGVar8->Ys
                                 [(long)(((prim + 1 + pGVar8->Offset) % iVar4 + iVar4) % iVar4) *
                                  (long)pGVar8->Stride] -
                   GImPlot->CurrentPlot->YAxis[iVar5].Range.Min) * GImPlot->My[iVar5] +
                  (double)GImPlot->PixelRange[iVar5].Min.y);
  fVar2 = (this->P1).x;
  fVar15 = (this->P1).y;
  fVar16 = fVar15;
  if (fVar14 <= fVar15) {
    fVar16 = fVar14;
  }
  bVar11 = false;
  if ((fVar16 < (cull_rect->Max).y) &&
     (fVar15 = (float)(-(uint)(fVar14 <= fVar15) & (uint)fVar15 |
                      ~-(uint)(fVar14 <= fVar15) & (uint)fVar14), pfVar1 = &(cull_rect->Min).y,
     bVar11 = false, *pfVar1 <= fVar15 && fVar15 != *pfVar1)) {
    fVar15 = fVar2;
    if (IVar13.x <= fVar2) {
      fVar15 = IVar13.x;
    }
    if (fVar15 < (cull_rect->Max).x) {
      fVar15 = (float)(~-(uint)(IVar13.x <= fVar2) & (uint)IVar13.x |
                      -(uint)(IVar13.x <= fVar2) & (uint)fVar2);
      bVar11 = (cull_rect->Min).x <= fVar15 && fVar15 != (cull_rect->Min).x;
    }
  }
  if (bVar11 != false) {
    fVar15 = (this->P1).y;
    fVar16 = fVar15 + this->HalfWeight;
    fVar15 = fVar15 - this->HalfWeight;
    IVar6 = this->Col;
    IVar3 = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    (pIVar9->pos).x = fVar2;
    (pIVar9->pos).y = fVar16;
    DrawList->_VtxWritePtr->uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar6;
    pIVar9[1].pos.x = IVar13.x;
    pIVar9[1].pos.y = fVar15;
    DrawList->_VtxWritePtr[1].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar6;
    pIVar9[2].pos.x = fVar2;
    pIVar9[2].pos.y = fVar15;
    pIVar9[2].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar6;
    pIVar9[3].pos.x = IVar13.x;
    pIVar9[3].pos.y = fVar16;
    pIVar9[3].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar12 = (ImDrawIdx)uVar7;
    *pIVar10 = IVar12;
    pIVar10[1] = IVar12 + 1;
    pIVar10[2] = IVar12 + 2;
    pIVar10[3] = IVar12;
    pIVar10[4] = IVar12 + 1;
    pIVar10[5] = IVar12 + 3;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
    fVar16 = IVar13.x - this->HalfWeight;
    fVar15 = this->HalfWeight + IVar13.x;
    fVar2 = (this->P1).y;
    IVar6 = this->Col;
    IVar3 = *uv;
    pIVar9[4].pos.x = fVar16;
    pIVar9[4].pos.y = fVar14;
    DrawList->_VtxWritePtr->uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar6;
    pIVar9[1].pos.x = fVar15;
    pIVar9[1].pos.y = fVar2;
    DrawList->_VtxWritePtr[1].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar6;
    pIVar9[2].pos.x = fVar16;
    pIVar9[2].pos.y = fVar2;
    pIVar9[2].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar6;
    pIVar9[3].pos.x = fVar15;
    pIVar9[3].pos.y = fVar14;
    pIVar9[3].uv = IVar3;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar12 = (ImDrawIdx)uVar7;
    *pIVar10 = IVar12;
    pIVar10[1] = IVar12 + 1;
    pIVar10[2] = IVar12 + 2;
    pIVar10[3] = IVar12;
    pIVar10[4] = IVar12 + 1;
    pIVar10[5] = IVar12 + 3;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  IVar13.y = fVar14;
  this->P1 = IVar13;
  return bVar11;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }